

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtBvhTriangleMeshShape * __thiscall
cbtCollisionWorldImporter::createBvhTriangleMeshShape
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterface *trimesh,cbtOptimizedBvh *bvh)

{
  int iVar1;
  int iVar2;
  cbtCollisionShape **ptr;
  cbtBvhTriangleMeshShape *this_00;
  cbtCollisionShape **ppcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  cbtVector3 local_38;
  
  this_00 = (cbtBvhTriangleMeshShape *)cbtAlignedAllocInternal(0x68,0x10);
  if (bvh == (cbtOptimizedBvh *)0x0) {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape(this_00,trimesh,true,true);
    iVar1 = (this->m_allocatedCollisionShapes).m_size;
    iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
    if (iVar1 != iVar2) goto LAB_008d8a9f;
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar6 <= iVar2) goto LAB_008d8a9f;
    if (iVar6 == 0) {
      ppcVar3 = (cbtCollisionShape **)0x0;
    }
    else {
      ppcVar3 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
    }
    lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        ppcVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_cbtQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    cbtBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
    iVar1 = (this->m_allocatedCollisionShapes).m_size;
    iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
    if (iVar1 != iVar2) goto LAB_008d8a9f;
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar6 <= iVar2) goto LAB_008d8a9f;
    if (iVar6 == 0) {
      ppcVar3 = (cbtCollisionShape **)0x0;
    }
    else {
      ppcVar3 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
    }
    lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        ppcVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if (ptr != (cbtCollisionShape **)0x0) {
    if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_allocatedCollisionShapes).m_data = (cbtCollisionShape **)0x0;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = ppcVar3;
  (this->m_allocatedCollisionShapes).m_capacity = iVar6;
LAB_008d8a9f:
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  (this->m_allocatedCollisionShapes).m_data[iVar1] = (cbtCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = iVar1 + 1;
  return this_00;
}

Assistant:

cbtBvhTriangleMeshShape* cbtCollisionWorldImporter::createBvhTriangleMeshShape(cbtStridingMeshInterface* trimesh, cbtOptimizedBvh* bvh)
{
	if (bvh)
	{
		cbtBvhTriangleMeshShape* bvhTriMesh = new cbtBvhTriangleMeshShape(trimesh, bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	cbtBvhTriangleMeshShape* ts = new cbtBvhTriangleMeshShape(trimesh, true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;
}